

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal64.c
# Opt level: O3

void * lyplg_type_print_decimal64
                 (ly_ctx *UNUSED_ctx,lyd_value *value,LY_VALUE_FORMAT format,
                 void *UNUSED_prefix_data,ly_bool *dynamic,size_t *value_len)

{
  size_t sVar1;
  anon_union_24_16_e2776397_for_lyd_value_2 *__s;
  
  if (format == LY_VALUE_LYB) {
    __s = &value->field_2;
    *dynamic = '\0';
    sVar1 = 8;
    if (value_len == (size_t *)0x0) {
      return __s;
    }
  }
  else {
    if (dynamic != (ly_bool *)0x0) {
      *dynamic = '\0';
    }
    __s = (anon_union_24_16_e2776397_for_lyd_value_2 *)value->_canonical;
    if (value_len == (size_t *)0x0) {
      return __s;
    }
    sVar1 = strlen(&__s->boolean);
  }
  *value_len = sVar1;
  return __s;
}

Assistant:

LIBYANG_API_DEF const void *
lyplg_type_print_decimal64(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *UNUSED(prefix_data), ly_bool *dynamic, size_t *value_len)
{
    int64_t num = 0;
    void *buf;

    if (format == LY_VALUE_LYB) {
        num = htole64(value->dec64);
        if (num == value->dec64) {
            /* values are equal, little-endian */
            *dynamic = 0;
            if (value_len) {
                *value_len = sizeof value->dec64;
            }
            return &value->dec64;
        } else {
            /* values differ, big-endian */
            buf = calloc(1, sizeof value->dec64);
            LY_CHECK_RET(!buf, NULL);

            *dynamic = 1;
            if (value_len) {
                *value_len = sizeof value->dec64;
            }
            memcpy(buf, &num, sizeof value->dec64);
            return buf;
        }
    }

    /* use the cached canonical value */
    if (dynamic) {
        *dynamic = 0;
    }
    if (value_len) {
        *value_len = strlen(value->_canonical);
    }
    return value->_canonical;
}